

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

DisasJumpType op_stura(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  TCGContext_conflict12 *tcg_ctx_00;
  TCGv_i64 addr;
  TCGTemp *local_20;
  
  if (((s->fields).presentO & 2) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    addr = get_address(s,0,(s->fields).c[1],0);
    o->addr1 = addr;
    tcg_gen_qemu_st_i64_s390x(tcg_ctx,o->in1,addr,3,(MemOp_conflict)s->insn->data);
    if ((int)((s->base).tb)->flags < 0) {
      tcg_ctx_00 = s->uc->tcg_ctx;
      tcg_gen_op2_s390x(tcg_ctx_00,INDEX_op_movi_i64,
                        (TCGArg)(tcg_ctx_00->psw_addr + (long)tcg_ctx_00),(s->base).pc_next);
      local_20 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      tcg_gen_callN_s390x(tcg_ctx,helper_per_store_real,(TCGTemp *)0x0,1,&local_20);
    }
    return DISAS_NEXT;
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_stura(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    o->addr1 = get_address(s, 0, get_field(s, r2), 0);
    tcg_gen_qemu_st_tl(tcg_ctx, o->in1, o->addr1, MMU_REAL_IDX, s->insn->data);

    if (s->base.tb->flags & FLAG_MASK_PER) {
        update_psw_addr(s);
        gen_helper_per_store_real(tcg_ctx, tcg_ctx->cpu_env);
    }
    return DISAS_NEXT;
}